

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar9 = 0;
  uVar4 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar4 = uVar9;
  }
  auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  for (; uVar9 != uVar4; uVar9 = uVar9 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
    fVar11 = (this->super_ELU).alpha;
    lVar10 = 0;
    for (iVar8 = 0; iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar27 = vminps_avx(*pauVar6,ZEXT1632(ZEXT816(0) << 0x40));
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar25._16_4_ = 0x42b0c0a5;
      auVar25._20_4_ = 0x42b0c0a5;
      auVar25._24_4_ = 0x42b0c0a5;
      auVar25._28_4_ = 0x42b0c0a5;
      auVar27 = vminps_avx(auVar27,auVar25);
      auVar26._8_4_ = 0xc2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._12_4_ = 0xc2b0c0a5;
      auVar26._16_4_ = 0xc2b0c0a5;
      auVar26._20_4_ = 0xc2b0c0a5;
      auVar26._24_4_ = 0xc2b0c0a5;
      auVar26._28_4_ = 0xc2b0c0a5;
      auVar25 = vmaxps_avx(auVar27,auVar26);
      auVar27._0_4_ = auVar25._0_4_ * 1.442695 + 0.5;
      auVar27._4_4_ = auVar25._4_4_ * 1.442695 + 0.5;
      auVar27._8_4_ = auVar25._8_4_ * 1.442695 + 0.5;
      auVar27._12_4_ = auVar25._12_4_ * 1.442695 + 0.5;
      auVar27._16_4_ = auVar25._16_4_ * 1.442695 + 0.5;
      auVar27._20_4_ = auVar25._20_4_ * 1.442695 + 0.5;
      auVar27._24_4_ = auVar25._24_4_ * 1.442695 + 0.5;
      auVar27._28_4_ = 0x3ff8aa3b;
      auVar13 = vroundps_avx(auVar27,1);
      auVar27 = vcmpps_avx(auVar27,auVar13,1);
      auVar27 = vandps_avx(auVar33._0_32_,auVar27);
      auVar27 = vsubps_avx(auVar13,auVar27);
      fVar14 = auVar25._0_4_ + auVar27._0_4_ * -0.6931472;
      fVar15 = auVar25._4_4_ + auVar27._4_4_ * -0.6931472;
      fVar16 = auVar25._8_4_ + auVar27._8_4_ * -0.6931472;
      fVar17 = auVar25._12_4_ + auVar27._12_4_ * -0.6931472;
      fVar18 = auVar25._16_4_ + auVar27._16_4_ * -0.6931472;
      fVar19 = auVar25._20_4_ + auVar27._20_4_ * -0.6931472;
      fVar20 = auVar25._24_4_ + auVar27._24_4_ * -0.6931472;
      auVar21._0_4_ = (int)auVar27._0_4_;
      auVar21._4_4_ = (int)auVar27._4_4_;
      auVar21._8_4_ = (int)auVar27._8_4_;
      auVar21._12_4_ = (int)auVar27._12_4_;
      auVar28._16_4_ = (int)auVar27._16_4_;
      auVar28._0_16_ = auVar21;
      auVar28._20_4_ = (int)auVar27._20_4_;
      auVar28._24_4_ = (int)auVar27._24_4_;
      auVar28._28_4_ = (int)auVar27._28_4_;
      auVar29 = vpslld_avx(auVar21,0x17);
      auVar21 = vpslld_avx(auVar28._16_16_,0x17);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar21 = vpaddd_avx(auVar21,auVar31);
      auVar29 = vpaddd_avx(auVar29,auVar31);
      auVar27 = vmaxps_avx(*pauVar6,ZEXT1632(ZEXT816(0) << 0x40));
      auVar13._0_4_ =
           ((auVar33._0_4_ + fVar14 +
            fVar14 * fVar14 *
            (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
              0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar29._0_4_ + -1.0) * fVar11
           + auVar27._0_4_;
      auVar13._4_4_ =
           ((auVar33._4_4_ + fVar15 +
            fVar15 * fVar15 *
            (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
              0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar29._4_4_ + -1.0) * fVar11
           + auVar27._4_4_;
      auVar13._8_4_ =
           ((auVar33._8_4_ + fVar16 +
            fVar16 * fVar16 *
            (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
              0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar29._8_4_ + -1.0) * fVar11
           + auVar27._8_4_;
      auVar13._12_4_ =
           ((auVar33._12_4_ + fVar17 +
            fVar17 * fVar17 *
            (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
              0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar29._12_4_ + -1.0) * fVar11
           + auVar27._12_4_;
      auVar13._16_4_ =
           ((auVar33._16_4_ + fVar18 +
            fVar18 * fVar18 *
            (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
              0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar21._0_4_ + -1.0) * fVar11
           + auVar27._16_4_;
      auVar13._20_4_ =
           ((auVar33._20_4_ + fVar19 +
            fVar19 * fVar19 *
            (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
              0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar21._4_4_ + -1.0) * fVar11
           + auVar27._20_4_;
      auVar13._24_4_ =
           ((auVar33._24_4_ + fVar20 +
            fVar20 * fVar20 *
            (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
              0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar21._8_4_ + -1.0) * fVar11
           + auVar27._24_4_;
      auVar13._28_4_ =
           auVar33._28_4_ + auVar25._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar27._28_4_;
      *pauVar6 = auVar13;
      pauVar6 = pauVar6 + 1;
      lVar10 = lVar10 + 8;
    }
    fVar11 = (this->super_ELU).alpha;
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar21 = vminps_avx(*(undefined1 (*) [16])*pauVar6,ZEXT816(0) << 0x40);
      auVar29._8_4_ = 0x42b0c0a5;
      auVar29._0_8_ = 0x42b0c0a542b0c0a5;
      auVar29._12_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar29);
      auVar22._8_4_ = 0xc2b0c0a5;
      auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar22._12_4_ = 0xc2b0c0a5;
      auVar31 = vmaxps_avx(auVar21,auVar22);
      auVar23._0_4_ = auVar31._0_4_ * 1.442695 + 0.5;
      auVar23._4_4_ = auVar31._4_4_ * 1.442695 + 0.5;
      auVar23._8_4_ = auVar31._8_4_ * 1.442695 + 0.5;
      auVar23._12_4_ = auVar31._12_4_ * 1.442695 + 0.5;
      auVar30._0_4_ = (int)auVar23._0_4_;
      auVar30._4_4_ = (int)auVar23._4_4_;
      auVar30._8_4_ = (int)auVar23._8_4_;
      auVar30._12_4_ = (int)auVar23._12_4_;
      auVar29 = vcvtdq2ps_avx(auVar30);
      auVar21 = vcmpps_avx(auVar23,auVar29,1);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar21 = vandps_avx(auVar21,auVar32);
      auVar21 = vsubps_avx(auVar29,auVar21);
      fVar14 = auVar31._0_4_ + auVar21._0_4_ * -0.6931472;
      fVar15 = auVar31._4_4_ + auVar21._4_4_ * -0.6931472;
      fVar16 = auVar31._8_4_ + auVar21._8_4_ * -0.6931472;
      fVar17 = auVar31._12_4_ + auVar21._12_4_ * -0.6931472;
      auVar24._0_4_ = (int)auVar21._0_4_;
      auVar24._4_4_ = (int)auVar21._4_4_;
      auVar24._8_4_ = (int)auVar21._8_4_;
      auVar24._12_4_ = (int)auVar21._12_4_;
      auVar21 = vpslld_avx(auVar24,0x17);
      auVar29 = vpaddd_avx(auVar21,auVar32);
      auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar6,ZEXT816(0) << 0x40);
      auVar12._0_4_ =
           ((fVar14 + 1.0 +
            fVar14 * fVar14 *
            (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
              0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar29._0_4_ + -1.0) * fVar11
           + auVar21._0_4_;
      auVar12._4_4_ =
           ((fVar15 + 1.0 +
            fVar15 * fVar15 *
            (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
              0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar29._4_4_ + -1.0) * fVar11
           + auVar21._4_4_;
      auVar12._8_4_ =
           ((fVar16 + 1.0 +
            fVar16 * fVar16 *
            (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
              0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar29._8_4_ + -1.0) * fVar11
           + auVar21._8_4_;
      auVar12._12_4_ =
           ((fVar17 + 1.0 +
            fVar17 * fVar17 *
            (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
              0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar29._12_4_ + -1.0) * fVar11
           + auVar21._12_4_;
      *(undefined1 (*) [16])*pauVar6 = auVar12;
      pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      lVar10 = lVar10 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar9;
    for (; (int)lVar10 < iVar7; lVar10 = lVar10 + 1) {
      fVar11 = *(float *)((long)pvVar1 + lVar10 * 4 + lVar5);
      if (fVar11 < 0.0) {
        fVar11 = expf(fVar11);
        auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = (fVar11 + -1.0) * (this->super_ELU).alpha;
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}